

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLReader::XMLReader
          (XMLReader *this,XMLCh *pubId,XMLCh *sysId,BinInputStream *streamToAdopt,
          Encodings encodingEnum,RefFrom from,Types type,Sources source,bool throwAtEnd,
          bool calculateSrcOfs,XMLSize_t lowWaterMark,XMLVersion version,MemoryManager *manager)

{
  XMLSize_t XVar1;
  int iVar2;
  XMLCh *pXVar3;
  XMLTranscoder *pXVar4;
  TranscodingException *this_00;
  undefined1 local_68 [8];
  ArrayJanitor<char16_t> jan;
  Codes failReason;
  XMLPlatformUtilsException *anon_var_0;
  bool calculateSrcOfs_local;
  bool throwAtEnd_local;
  RefFrom from_local;
  Encodings encodingEnum_local;
  BinInputStream *streamToAdopt_local;
  XMLCh *sysId_local;
  XMLCh *pubId_local;
  XMLReader *this_local;
  
  XMemory::XMemory((XMemory *)this);
  this->fCharIndex = 0;
  this->fCharsAvail = 0;
  this->fCurCol = 1;
  this->fCurLine = 1;
  this->fEncoding = UTF_8;
  this->fEncodingStr = (XMLCh *)0x0;
  this->fForcedEncoding = true;
  this->fNoMore = false;
  pXVar3 = XMLString::replicate(pubId,manager);
  this->fPublicId = pXVar3;
  this->fRawBufIndex = 0;
  this->fRawBytesAvail = 0;
  this->fLowWaterMark = lowWaterMark;
  this->fReaderNum = 0xffffffff;
  this->fRefFrom = from;
  this->fSentTrailingSpace = false;
  this->fSource = source;
  this->fSrcOfsBase = 0;
  this->fSrcOfsSupported = false;
  this->fCalculateSrcOfs = calculateSrcOfs;
  pXVar3 = XMLString::replicate(sysId,manager);
  this->fSystemId = pXVar3;
  this->fStream = streamToAdopt;
  this->fSwapped = false;
  this->fThrowAtEnd = throwAtEnd;
  this->fTranscoder = (XMLTranscoder *)0x0;
  this->fType = type;
  this->fMemoryManager = manager;
  setXMLVersion(this,version);
  refreshRawBuffer(this);
  iVar2 = (*XMLPlatformUtils::fgTransService->_vptr_XMLTransService[6])();
  this->fSrcOfsSupported = (bool)((byte)iVar2 & 1);
  this->fEncoding = encodingEnum;
  pXVar3 = XMLRecognizer::nameForEncoding(this->fEncoding,this->fMemoryManager);
  pXVar3 = XMLString::replicate(pXVar3,this->fMemoryManager);
  this->fEncodingStr = pXVar3;
  checkForSwapped(this);
  pXVar4 = XMLTransService::makeNewTranscoderFor
                     (XMLPlatformUtils::fgTransService,this->fEncoding,
                      (Codes *)((long)&jan.fMemoryManager + 4),0x4000,this->fMemoryManager);
  this->fTranscoder = pXVar4;
  if (this->fTranscoder == (XMLTranscoder *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fSystemId);
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)local_68,this->fEncodingStr,this->fMemoryManager);
    this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
               ,0x1cc,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(this_00,&TranscodingException::typeinfo,TranscodingException::~TranscodingException)
    ;
  }
  if ((this->fType == Type_PE) && (this->fRefFrom == RefFrom_NonLiteral)) {
    this->fCharSizeBuf[this->fCharsAvail] = '\0';
    this->fCharOfsBuf[this->fCharsAvail] = 0;
    XVar1 = this->fCharsAvail;
    this->fCharsAvail = XVar1 + 1;
    this->fCharBuf[XVar1] = L' ';
  }
  return;
}

Assistant:

XMLReader::XMLReader(const  XMLCh* const          pubId
                    , const XMLCh* const          sysId
                    ,       BinInputStream* const streamToAdopt
                    , XMLRecognizer::Encodings    encodingEnum
                    , const RefFrom               from
                    , const Types                 type
                    , const Sources               source
                    , const bool                  throwAtEnd
                    , const bool                  calculateSrcOfs
                    ,       XMLSize_t             lowWaterMark
                    , const XMLVersion            version
                    ,       MemoryManager* const  manager) :
    fCharIndex(0)
    , fCharsAvail(0)
    , fCurCol(1)
    , fCurLine(1)
    , fEncoding(XMLRecognizer::UTF_8)
    , fEncodingStr(0)
    , fForcedEncoding(true)
    , fNoMore(false)
    , fPublicId(XMLString::replicate(pubId, manager))
    , fRawBufIndex(0)
    , fRawBytesAvail(0)
    , fLowWaterMark (lowWaterMark)
    , fReaderNum(0xFFFFFFFF)
    , fRefFrom(from)
    , fSentTrailingSpace(false)
    , fSource(source)
    , fSrcOfsBase(0)
    , fSrcOfsSupported(false)
    , fCalculateSrcOfs(calculateSrcOfs)
    , fSystemId(XMLString::replicate(sysId, manager))
    , fStream(streamToAdopt)
    , fSwapped(false)
    , fThrowAtEnd(throwAtEnd)
    , fTranscoder(0)
    , fType(type)
    , fMemoryManager(manager)
{
    setXMLVersion(version);

    try
    {
        // Do an initial load of raw bytes
        refreshRawBuffer();
    }
    catch (const XMLPlatformUtilsException&)
    {
        cleanup();
        throw;
    }

    // Ask the transcoding service if it supports src offset info
    fSrcOfsSupported = XMLPlatformUtils::fgTransService->supportsSrcOfs();

    //
    //  Use the passed encoding code
    //
    fEncoding = encodingEnum;
    fEncodingStr = XMLString::replicate(XMLRecognizer::nameForEncoding(fEncoding, fMemoryManager), fMemoryManager);

    // Check whether the fSwapped flag should be set or not
    checkForSwapped();

    //
    //  Create a transcoder for the encoding. Since the encoding has been
    //  forced, this will be the one we will use, period.
    //
    XMLTransService::Codes failReason;
    fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
    (
        fEncoding
        , failReason
        , kCharBufSize
        , fMemoryManager
    );

    if (!fTranscoder)
    {
        // We are about to throw which means the d-tor won't be called.
        // Clean up some memory.
        //
        fMemoryManager->deallocate(fPublicId);
        fMemoryManager->deallocate(fSystemId);
        ArrayJanitor<XMLCh> jan (fEncodingStr, fMemoryManager);

        ThrowXMLwithMemMgr1
        (
            TranscodingException
            , XMLExcepts::Trans_CantCreateCvtrFor
            , fEncodingStr
            , fMemoryManager
        );
    }

    //
    //  Note that, unlike above, we do not do an initial decode of the
    //  first line. We take the caller's word that the encoding is correct
    //  and just assume that the first bulk decode (kicked off by the first
    //  get of a character) will work.
    //
    //  So we do here the slipping in of the leading space if required.
    //
    if ((fType == Type_PE) && (fRefFrom == RefFrom_NonLiteral))
    {
        // This represents no data from the source
        fCharSizeBuf[fCharsAvail] = 0;
        fCharOfsBuf[fCharsAvail] = 0;
        fCharBuf[fCharsAvail++] = chSpace;
    }
}